

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

double absl::lts_20250127::anon_unknown_0::FloatTraits<double>::MakeNan(Nonnull<const_char_*> tagp)

{
  double dVar1;
  Nonnull<const_char_*> tagp_local;
  
  dVar1 = nan(tagp);
  return dVar1;
}

Assistant:

static double MakeNan(absl::Nonnull<const char*> tagp) {
#if ABSL_HAVE_BUILTIN(__builtin_nan)
    // Use __builtin_nan() if available since it has a fix for
    // https://bugs.llvm.org/show_bug.cgi?id=37778
    // std::nan may use the glibc implementation.
    return __builtin_nan(tagp);
#else
    // Support nan no matter which namespace it's in.  Some platforms
    // incorrectly don't put it in namespace std.
    using namespace std;  // NOLINT
    return nan(tagp);
#endif
  }